

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O1

void __thiscall
modified_signaturecase::_impl<picnic_params_t>
          (modified_signaturecase *this,anon_enum_32 *parameters)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  result_type rVar5;
  void *__dest;
  uint uVar6;
  ulong uVar7;
  size_t __n;
  long lVar8;
  ulong uVar9;
  context_frame context_frame_1590;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  size_t max_signature_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  default_random_engine eng;
  size_t signature_len;
  uniform_int_distribution<unsigned_int> dist_pos;
  uniform_int_distribution<unsigned_int> dist_diff;
  picnic_privatekey_t sk;
  picnic_publickey_t pk;
  random_device rnd;
  context_frame local_160c;
  undefined1 local_1608 [16];
  shared_count local_15f8;
  char **local_15f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_15e8;
  undefined *local_15c8;
  value_expr<int> local_15bc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_15b8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_15a0;
  undefined *local_1598;
  param_type local_1590;
  char *local_1588;
  char *local_1580;
  assertion_result local_1578;
  param_type local_1560;
  const_string local_1558;
  const_string local_1548;
  const_string local_1538;
  assertion_result local_1528;
  char *local_1510;
  char *local_14c0;
  char *local_14b8;
  const_string local_1478;
  const_string local_1468;
  const_string local_1458;
  const_string local_1448;
  const_string local_1438;
  const_string local_1428;
  const_string local_1418;
  const_string local_1408;
  const_string local_13f8;
  const_string local_13e8;
  const_string local_13d8;
  const_string local_13c8;
  undefined1 local_13b8 [5000];
  
  local_1528.m_message.px._0_1_ = 0;
  local_1528._0_8_ = &PTR__lazy_ostream_00184600;
  local_1528.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1510 = "Parameter set: ";
  local_14c0 = (char *)picnic_get_param_name(*parameters);
  local_13b8[8] = false;
  local_13b8._0_8_ = &PTR__lazy_ostream_00186760;
  local_13b8._16_8_ = &local_1528;
  local_13b8._24_8_ = &local_14c0;
  boost::test_tools::tt_detail::context_frame::context_frame(&local_160c,(lazy_ostream *)local_13b8)
  ;
  bVar2 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&local_160c);
  if (bVar2) {
    local_15c8 = (undefined *)picnic_signature_size(*parameters);
    local_13c8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13c8.m_end = "";
    local_13d8.m_begin = "";
    local_13d8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_13c8,0xa1,&local_13d8);
    local_1608._0_8_ = &local_15c8;
    boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
              (&local_1528,(value_expr<const_unsigned_long_&> *)local_1608,false);
    local_14c0 = "max_signature_size";
    local_14b8 = "";
    local_13b8[8] = false;
    local_13b8._0_8_ = &PTR__lazy_ostream_001867a0;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_13e8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13e8.m_end = "";
    local_13b8._24_8_ = &local_14c0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1528,(lazy_ostream *)local_13b8,&local_13e8,0xa1,CHECK,CHECK_BUILT_ASSERTION,0
              );
    boost::detail::shared_count::~shared_count(&local_1528.m_message.pn);
    local_13f8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13f8.m_end = "";
    local_1408.m_begin = "";
    local_1408.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_13f8,0xa5,&local_1408);
    iVar3 = picnic_keygen(*parameters,&local_14c0,&local_1528);
    local_15b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_15b8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,iVar3 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)local_1608,(value_expr<bool> *)&local_15b8,false);
    local_13b8._24_8_ = &local_15e8;
    local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "!picnic_keygen(parameters, &pk, &sk)";
    local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    local_13b8[8] = false;
    local_13b8._0_8_ = &PTR__lazy_ostream_001867a0;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_1418.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1418.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1608,(lazy_ostream *)local_13b8,&local_1418,0xa5,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_15f8);
    local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_15b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_15b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_15b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_15e8,(size_type)local_15c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_15b8,0x200);
    (anonymous_namespace)::
    randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&local_15b8);
    local_1598 = local_15c8;
    local_1428.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1428.m_end = "";
    local_1438.m_begin = "";
    local_1438.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1428,0xb0,&local_1438);
    iVar3 = picnic_sign(&local_1528,
                        local_15b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start,0x200,
                        local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start,&local_1598);
    local_1588._0_1_ = iVar3 == 0;
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)local_1608,(value_expr<bool> *)&local_1588,false);
    local_1578._0_8_ =
         "!picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len)";
    local_1578.m_message.px = (element_type *)0x168e3c;
    local_13b8[8] = false;
    local_13b8._0_8_ = &PTR__lazy_ostream_001867a0;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_1448.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1448.m_end = "";
    local_13b8._24_8_ = &local_1578;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1608,(lazy_ostream *)local_13b8,&local_1448,0xb0,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_15f8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_15e8,(size_type)local_1598);
    local_1458.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1458.m_end = "";
    local_1468.m_begin = "";
    local_1468.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1458,0xb3,&local_1468);
    iVar3 = picnic_verify(&local_14c0,
                          local_15b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,0x200,
                          local_15e8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_15e8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_15e8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    local_1588 = (char *)CONCAT71(local_1588._1_7_,iVar3 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)local_1608,(value_expr<bool> *)&local_1588,false);
    local_1578._0_8_ =
         "!picnic_verify(&pk, message.data(), message_size, signature.data(), signature.size())";
    local_1578.m_message.px = (element_type *)0x169172;
    local_13b8[8] = false;
    local_13b8._0_8_ = &PTR__lazy_ostream_001867a0;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_1478.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1478.m_end = "";
    local_13b8._24_8_ = &local_1578;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1608,(lazy_ostream *)local_13b8,&local_1478,0xb3,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_15f8);
    local_1560._M_a = 1;
    local_1560._M_b = 0xff;
    local_1590._M_a = 1;
    local_1590._M_b = 0x33262;
    std::random_device::random_device((random_device *)local_13b8);
    uVar4 = std::random_device::_M_getval();
    uVar6 = uVar4 / 0x7fffffff << 0x1f | uVar4 / 0x7fffffff;
    local_15a0._M_x = (unsigned_long)(uVar6 + uVar4 + (uint)(uVar4 + uVar6 == 0));
    rVar5 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_1590,&local_15a0,&local_1590
                      );
    uVar9 = (ulong)rVar5;
    lVar8 = -0x20;
    do {
      uVar7 = (long)local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (uVar7 == 0) {
        __dest = (void *)0x0;
      }
      else {
        if ((long)uVar7 < 0) {
          std::__throw_bad_alloc();
        }
        __dest = operator_new(uVar7);
      }
      __n = (long)local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      if (__n != 0) {
        memmove(__dest,local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,__n);
      }
      rVar5 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&local_1560,&local_15a0,
                         &local_1560);
      pcVar1 = (char *)((long)__dest + uVar9 % __n);
      *pcVar1 = *pcVar1 + (char)rVar5;
      local_1538.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
      ;
      local_1538.m_end = "";
      local_1548.m_begin = "";
      local_1548.m_end = "";
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1538,0xc0,&local_1548
                );
      local_15bc.m_value =
           picnic_verify(&local_14c0,
                         local_15b8.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,0x200,__dest,__n);
      boost::test_tools::assertion::value_expr<int>::evaluate(&local_1578,&local_15bc,false);
      local_1588 = 
      "picnic_verify(&pk, message.data(), message_size, signature2.data(), signature2.size())";
      local_1580 = "";
      local_1608[8] = false;
      local_1608._0_8_ = &PTR__lazy_ostream_001867a0;
      local_15f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_15f0 = &local_1588;
      local_1558.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
      ;
      local_1558.m_end = "";
      boost::test_tools::tt_detail::report_assertion
                (&local_1578,(lazy_ostream *)local_1608,&local_1558,0xc0,CHECK,CHECK_BUILT_ASSERTION
                 ,0);
      boost::detail::shared_count::~shared_count(&local_1578.m_message.pn);
      if (__dest != (void *)0x0) {
        operator_delete(__dest);
      }
      rVar5 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&local_1590,&local_15a0,
                         &local_1590);
      uVar9 = uVar9 + rVar5;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0);
    std::random_device::_M_fini();
    if (local_15b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_15b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_15e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  boost::test_tools::tt_detail::context_frame::~context_frame(&local_160c);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(modified_signature, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature, message;
    signature.resize(max_signature_size);

    const size_t message_size = message_inc;
    message.resize(message_size);
    // fill message with some data
    randomize_container(message);

    size_t signature_len = max_signature_size;
    BOOST_TEST(!picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len));
    signature.resize(signature_len);
    BOOST_TEST(
        !picnic_verify(&pk, message.data(), message_size, signature.data(), signature.size()));

    std::uniform_int_distribution<unsigned int> dist_diff{1, 255};
    std::uniform_int_distribution<unsigned int> dist_pos{1, PICNIC_MAX_SIGNATURE_SIZE};
    std::random_device rnd;
    std::default_random_engine eng{rnd()};

    for (size_t l = dist_pos(eng), rounds = rep; rounds; l += dist_pos(eng), --rounds) {
      std::vector<uint8_t> signature2{signature};
      signature2[l % signature2.size()] += dist_diff(eng);

      // must fail
      BOOST_TEST(
          picnic_verify(&pk, message.data(), message_size, signature2.data(), signature2.size()));
    }
  }
}